

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rock_sample.cpp
# Opt level: O1

bool __thiscall
despot::RockSample::Step
          (RockSample *this,State *state,double rand_num,ACT_TYPE action,double *reward,
          OBS_TYPE *obs)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  double dVar4;
  
  *reward = 0.0;
  *obs = 2;
  if (action < 4) {
    switch(action) {
    case 0:
      iVar2 = BaseRockSample::GetY(&this->super_BaseRockSample,state);
      if (iVar2 + 1 < (this->super_BaseRockSample).size_) {
        BaseRockSample::IncY(&this->super_BaseRockSample,state);
      }
      else {
LAB_00113e28:
        *reward = -100.0;
      }
      break;
    case 1:
      iVar2 = BaseRockSample::GetX(&this->super_BaseRockSample,state);
      if ((this->super_BaseRockSample).size_ <= iVar2 + 1) {
        *reward = 10.0;
        return true;
      }
      BaseRockSample::IncX(&this->super_BaseRockSample,state);
      break;
    case 2:
      iVar2 = BaseRockSample::GetY(&this->super_BaseRockSample,state);
      if (iVar2 < 1) goto LAB_00113e28;
      BaseRockSample::DecY(&this->super_BaseRockSample,state);
      break;
    case 3:
      iVar2 = BaseRockSample::GetX(&this->super_BaseRockSample,state);
      if (iVar2 < 1) goto LAB_00113e28;
      BaseRockSample::DecX(&this->super_BaseRockSample,state);
      break;
    default:
      goto switchD_00113da4_default;
    }
  }
  if (action == 4) {
    iVar2 = BaseRockSample::GetRobPosIndex(&this->super_BaseRockSample,state);
    piVar3 = Grid<int>::operator()(&(this->super_BaseRockSample).grid_,iVar2);
    iVar2 = *piVar3;
    if (iVar2 < 0) {
      *reward = -100.0;
    }
    else {
      bVar1 = BaseRockSample::GetRock(&this->super_BaseRockSample,state,iVar2);
      if (bVar1) {
        dVar4 = 10.0;
      }
      else {
        dVar4 = -10.0;
      }
      *reward = dVar4;
      BaseRockSample::SampleRock(&this->super_BaseRockSample,state,iVar2);
    }
  }
switchD_00113da4_default:
  if (4 < action) {
    if ((this->super_BaseRockSample).num_rocks_ <= action + -5) {
      __assert_fail("rock < num_rocks_",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/examples/cpp_models/rock_sample/src/rock_sample/rock_sample.cpp"
                    ,0x4c,
                    "virtual bool despot::RockSample::Step(State &, double, ACT_TYPE, double &, OBS_TYPE &) const"
                   );
    }
    bVar1 = BaseRockSample::GetObservation
                      (&this->super_BaseRockSample,rand_num,(RockSampleState *)state,action + -5);
    *obs = (ulong)bVar1;
  }
  return false;
}

Assistant:

bool RockSample::Step(State& state, double rand_num, ACT_TYPE action, double& reward,
	OBS_TYPE& obs) const {
	RockSampleState& rockstate = static_cast<RockSampleState&>(state);
	reward = 0;
	obs = E_NONE;

	if (action < E_SAMPLE) { // Move
		switch (action) {
		case Compass::EAST:
			if (GetX(&rockstate) + 1 < size_) {
				IncX(&rockstate);
				break;
			} else {
				reward = +10;
				return true;
			}

		case Compass::NORTH:
			if (GetY(&rockstate) + 1 < size_)
				IncY(&rockstate);
			else
				reward = -100;
			break;

		case Compass::SOUTH:
			if (GetY(&rockstate) - 1 >= 0)
				DecY(&rockstate);
			else
				reward = -100;
			break;

		case Compass::WEST:
			if (GetX(&rockstate) - 1 >= 0)
				DecX(&rockstate);
			else
				reward = -100;
			break;
		}
	}

	if (action == E_SAMPLE) { // Sample
		int rock = grid_(GetRobPosIndex(&rockstate));
		if (rock >= 0) {
			if (GetRock(&rockstate, rock))
				reward = +10;
			else
				reward = -10;
			SampleRock(&rockstate, rock);
		} else {
			reward = -100;
		}
	}

	if (action > E_SAMPLE) { // Sense
		int rock = action - E_SAMPLE - 1;
		assert(rock < num_rocks_);
		obs = GetObservation(rand_num, rockstate, rock);
	}

	// assert(reward != -100);
	return false;
}